

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O1

RK_S32 mpi_enc_opt_lmdi(void *ctx,char *next)

{
  int iVar1;
  
  if (next == (char *)0x0) {
    _mpp_log_l(2,"mpi_enc_utils","invalid intra lambda idx\n",0);
  }
  else {
    iVar1 = atoi(next);
    *(int *)((long)ctx + 0xd4) = iVar1;
  }
  return (uint)(next != (char *)0x0);
}

Assistant:

RK_S32 mpi_enc_opt_lmdi(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        cmd->lambda_idx_i = atoi(next);
        return 1;
    }

    mpp_err("invalid intra lambda idx\n");
    return 0;
}